

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

AssertionResult __thiscall
testing::internal::DoubleNearPredFormat
          (internal *this,char *expr1,char *expr2,char *abs_error_expr,double val1,double val2,
          double abs_error)

{
  AssertionResult *pAVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar3;
  AssertionResult local_58;
  double local_48;
  double diff;
  double abs_error_local;
  double val2_local;
  double val1_local;
  char *abs_error_expr_local;
  char *expr2_local;
  char *expr1_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  local_48 = ABS(val1 - val2);
  diff = abs_error;
  abs_error_local = val2;
  val2_local = val1;
  val1_local = (double)abs_error_expr;
  abs_error_expr_local = expr2;
  expr2_local = expr1;
  expr1_local = (char *)this;
  if (abs_error < local_48) {
    AssertionFailure();
    pAVar1 = AssertionResult::operator<<(&local_58,(char (*) [24])"The difference between ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&expr2_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [6])" and ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&abs_error_expr_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" is ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_48);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [17])", which exceeds ");
    pAVar1 = AssertionResult::operator<<(pAVar1,(char **)&val1_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [9])", where\n");
    pAVar1 = AssertionResult::operator<<(pAVar1,&expr2_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [15])" evaluates to ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&val2_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])0x19c157);
    pAVar1 = AssertionResult::operator<<(pAVar1,&abs_error_expr_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [15])" evaluates to ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&abs_error_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [7])", and\n");
    pAVar1 = AssertionResult::operator<<(pAVar1,(char **)&val1_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [15])" evaluates to ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&diff);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [2])0x19c12d);
    AssertionResult::AssertionResult((AssertionResult *)this,pAVar1);
    AssertionResult::~AssertionResult(&local_58);
    sVar2.ptr_ = extraout_RDX;
  }
  else {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult DoubleNearPredFormat(const char* expr1,
                                     const char* expr2,
                                     const char* abs_error_expr,
                                     double val1,
                                     double val2,
                                     double abs_error) {
  const double diff = fabs(val1 - val2);
  if (diff <= abs_error) return AssertionSuccess();

  // FIXME: do not print the value of an expression if it's
  // already a literal.
  return AssertionFailure()
      << "The difference between " << expr1 << " and " << expr2
      << " is " << diff << ", which exceeds " << abs_error_expr << ", where\n"
      << expr1 << " evaluates to " << val1 << ",\n"
      << expr2 << " evaluates to " << val2 << ", and\n"
      << abs_error_expr << " evaluates to " << abs_error << ".";
}